

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::BlindRawTransactionRequest::BlindRawTransactionRequest
          (BlindRawTransactionRequest *this)

{
  allocator local_11;
  BlindRawTransactionRequest *local_10;
  BlindRawTransactionRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindRawTransactionRequest_01b4c9a0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tx_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  core::JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>
  ::JsonObjectVector(&this->txins_);
  core::
  JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>::
  JsonObjectVector(&this->txouts_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->txout_confidential_addresses_);
  core::
  JsonObjectVector<cfd::js::api::json::BlindIssuanceRequest,_cfd::js::api::BlindIssuanceRequestStruct>
  ::JsonObjectVector(&this->issuances_);
  this->minimum_range_value_ = 1;
  this->exponent_ = 0;
  this->minimum_bits_ = 0x34;
  this->collect_blinder_ = false;
  CollectFieldName();
  return;
}

Assistant:

BlindRawTransactionRequest() {
    CollectFieldName();
  }